

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_272f4d1::GetSseSum16x16DualTest_MaxMseSum_Test::TestBody
          (GetSseSum16x16DualTest_MaxMseSum_Test *this)

{
  int source_stride;
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  uint *puVar6;
  SEARCH_METHODS *pSVar7;
  uint *puVar8;
  uint32_t *var16x16;
  uint32_t *sse16x16;
  long lVar9;
  long lVar10;
  uint16_t in_FPUControlWord;
  uint16_t in_FPUTagWord;
  undefined8 in_FPUInstructionPointer;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_4b0;
  AssertHelper local_4a8;
  int sum_tot_simd;
  int sum_tot_c;
  uint sse_tot_simd;
  uint sse_tot_c;
  RegisterStateCheckMMX reg_check_mmx;
  uint var2 [64];
  uint var1 [64];
  uint sse2 [64];
  uint sse1 [64];
  
  memset((this->super_GetSseSum16x16DualTest).src_,0xff,
         (long)(this->super_GetSseSum16x16DualTest).params_.block_size);
  memset((this->super_GetSseSum16x16DualTest).ref_,0,
         (long)(this->super_GetSseSum16x16DualTest).params_.block_size);
  memset(sse1,0,0x100);
  memset(sse2,0,0x100);
  memset(var1,0,0x100);
  memset(var2,0,0x100);
  iVar5 = 0;
  sse_tot_c = 0;
  sse_tot_simd = 0;
  sum_tot_c = 0;
  sum_tot_simd = 0;
  iVar3 = (this->super_GetSseSum16x16DualTest).params_.height;
  if (0 < iVar3) {
    source_stride = (this->super_GetSseSum16x16DualTest).params_.width;
    lVar10 = 0;
    lVar4 = 0;
    iVar2 = source_stride;
    do {
      if (0 < iVar2) {
        var16x16 = var2 + iVar5;
        sse16x16 = sse2 + iVar5;
        puVar8 = var1 + iVar5;
        puVar6 = sse1 + iVar5;
        iVar3 = 0;
        lVar9 = lVar10;
        do {
          reg_check_mmx.pre_fpu_env_._12_4_ = SUB84(in_FPUInstructionPointer,0);
          reg_check_mmx.pre_fpu_env_[8] = (uint16_t)((ulong)in_FPUInstructionPointer >> 0x20);
          reg_check_mmx.pre_fpu_env_[0] = in_FPUControlWord;
          reg_check_mmx.pre_fpu_env_[4] = in_FPUTagWord;
          (*(this->super_GetSseSum16x16DualTest).params_.func)
                    ((this->super_GetSseSum16x16DualTest).src_ + lVar9,source_stride,
                     (this->super_GetSseSum16x16DualTest).ref_ + lVar9,source_stride,puVar6,
                     &sse_tot_simd,&sum_tot_simd,puVar8);
          libaom_test::RegisterStateCheckMMX::Check(&reg_check_mmx);
          aom_get_var_sse_sum_16x16_dual_c
                    ((this->super_GetSseSum16x16DualTest).src_ + lVar9,source_stride,
                     (this->super_GetSseSum16x16DualTest).ref_ + lVar9,source_stride,sse16x16,
                     &sse_tot_c,&sum_tot_c,var16x16);
          iVar2 = (this->super_GetSseSum16x16DualTest).params_.width;
          iVar3 = iVar3 + 0x20;
          lVar9 = lVar9 + 0x20;
          iVar5 = iVar5 + 2;
          var16x16 = var16x16 + 2;
          sse16x16 = sse16x16 + 2;
          puVar8 = puVar8 + 2;
          puVar6 = puVar6 + 2;
        } while (iVar3 < iVar2);
        iVar3 = (this->super_GetSseSum16x16DualTest).params_.height;
      }
      lVar4 = lVar4 + 0x10;
      lVar10 = lVar10 + (long)source_stride * 0x10;
    } while (lVar4 < iVar3);
  }
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&reg_check_mmx,"sse_tot_c","sse_tot_simd",&sse_tot_c,&sse_tot_simd);
  if ((char)reg_check_mmx.pre_fpu_env_[0] == '\0') {
    testing::Message::Message((Message *)&local_4b0);
    puVar1 = (undefined8 *)
             CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                      CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
    if (puVar1 == (undefined8 *)0x0) {
      pSVar7 = "";
    }
    else {
      pSVar7 = (SEARCH_METHODS *)*puVar1;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_4a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/variance_test.cc"
               ,0x436,(char *)pSVar7);
    testing::internal::AssertHelper::operator=(&local_4a8,(Message *)&local_4b0);
    testing::internal::AssertHelper::~AssertHelper(&local_4a8);
    if (local_4b0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_4b0._M_head_impl + 8))();
    }
  }
  puVar1 = (undefined8 *)
           CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                    CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
  if (puVar1 != (undefined8 *)0x0) {
    if ((undefined8 *)*puVar1 != puVar1 + 2) {
      operator_delete((undefined8 *)*puVar1);
    }
    operator_delete(puVar1);
  }
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&reg_check_mmx,"sum_tot_c","sum_tot_simd",&sum_tot_c,&sum_tot_simd);
  if ((char)reg_check_mmx.pre_fpu_env_[0] == '\0') {
    testing::Message::Message((Message *)&local_4b0);
    puVar1 = (undefined8 *)
             CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                      CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
    if (puVar1 == (undefined8 *)0x0) {
      pSVar7 = "";
    }
    else {
      pSVar7 = (SEARCH_METHODS *)*puVar1;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_4a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/variance_test.cc"
               ,0x437,(char *)pSVar7);
    testing::internal::AssertHelper::operator=(&local_4a8,(Message *)&local_4b0);
    testing::internal::AssertHelper::~AssertHelper(&local_4a8);
    if (local_4b0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_4b0._M_head_impl + 8))();
    }
  }
  puVar1 = (undefined8 *)
           CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                    CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
  if (puVar1 != (undefined8 *)0x0) {
    if ((undefined8 *)*puVar1 != puVar1 + 2) {
      operator_delete((undefined8 *)*puVar1);
    }
    operator_delete(puVar1);
  }
  lVar4 = 0;
  do {
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)&reg_check_mmx,"sse1[p]","sse2[p]",(uint *)((long)sse1 + lVar4),
               (uint *)((long)sse2 + lVar4));
    if ((char)reg_check_mmx.pre_fpu_env_[0] == '\0') {
      testing::Message::Message((Message *)&local_4b0);
      puVar1 = (undefined8 *)
               CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                        CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
      pSVar7 = "";
      if (puVar1 != (undefined8 *)0x0) {
        pSVar7 = (SEARCH_METHODS *)*puVar1;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_4a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/variance_test.cc"
                 ,0x43a,(char *)pSVar7);
      testing::internal::AssertHelper::operator=(&local_4a8,(Message *)&local_4b0);
      testing::internal::AssertHelper::~AssertHelper(&local_4a8);
      if (local_4b0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_4b0._M_head_impl + 8))();
      }
    }
    puVar1 = (undefined8 *)
             CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                      CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
    if (puVar1 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar1 != puVar1 + 2) {
        operator_delete((undefined8 *)*puVar1);
      }
      operator_delete(puVar1);
    }
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)&reg_check_mmx,"var1[p]","var2[p]",(uint *)((long)var1 + lVar4),
               (uint *)((long)var2 + lVar4));
    if ((char)reg_check_mmx.pre_fpu_env_[0] == '\0') {
      testing::Message::Message((Message *)&local_4b0);
      puVar1 = (undefined8 *)
               CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                        CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
      pSVar7 = "";
      if (puVar1 != (undefined8 *)0x0) {
        pSVar7 = (SEARCH_METHODS *)*puVar1;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_4a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/variance_test.cc"
                 ,0x43b,(char *)pSVar7);
      testing::internal::AssertHelper::operator=(&local_4a8,(Message *)&local_4b0);
      testing::internal::AssertHelper::~AssertHelper(&local_4a8);
      if (local_4b0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_4b0._M_head_impl + 8))();
      }
    }
    puVar1 = (undefined8 *)
             CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                      CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
    if (puVar1 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar1 != puVar1 + 2) {
        operator_delete((undefined8 *)*puVar1);
      }
      operator_delete(puVar1);
    }
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0x100);
  return;
}

Assistant:

TEST_P(GetSseSum16x16DualTest, MaxMseSum) { MaxTestSseSumDual(); }